

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  ReadableDirectory *extraout_RDX;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar1;
  NullableValue<kj::OwnFd> local_30;
  Own<kj::ReadableDirectory,_std::nullptr_t> local_28;
  
  tryOpenSubdirInternal((DiskHandle *)&local_30,path);
  Maybe<kj::OwnFd>::map<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_(&)(kj::OwnFd)>
            ((Maybe<kj::OwnFd> *)&local_28,
             (_func_Own<kj::ReadableDirectory,_std::nullptr_t>_OwnFd *)&local_30);
  *(Disposer **)this = local_28.disposer;
  *(ReadableDirectory **)(this + 2) = local_28.ptr;
  local_28.ptr = (ReadableDirectory *)0x0;
  Own<kj::ReadableDirectory,_std::nullptr_t>::dispose(&local_28);
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&local_30);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }